

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.hpp
# Opt level: O1

Violation __thiscall
mp::AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<-2>>::
ComputeViolation<std::vector<double,std::allocator<double>>>
          (AlgebraicConstraint<mp::LinTerms,mp::AlgConRhs<_2>> *this,
          vector<double,_std::allocator<double>_> *x,bool logical)

{
  double dVar1;
  long lVar2;
  double dVar3;
  double dVar4;
  Violation VVar5;
  Violation VVar6;
  Violation VVar7;
  
  lVar2 = *(long *)(this + 0x30);
  if (lVar2 == 0) {
    dVar3 = 0.0;
  }
  else {
    dVar3 = 0.0;
    do {
      dVar3 = *(double *)(*(long *)(this + 0x20) + -8 + lVar2 * 8) *
              (x->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_start[*(int *)(*(long *)(this + 0x68) + -4 + lVar2 * 4)] +
              dVar3;
      lVar2 = lVar2 + -1;
    } while (lVar2 != 0);
  }
  dVar1 = *(double *)(this + 0x98);
  if (!logical) {
    if (dVar3 <= dVar1) {
      dVar4 = dVar3 - dVar1;
      if (dVar3 - dVar1 <= -INFINITY - dVar3) {
        dVar4 = -INFINITY - dVar3;
      }
      VVar7.valX_ = 0.0;
      VVar7.viol_ = dVar4;
      return VVar7;
    }
    VVar6.viol_ = dVar3 - dVar1;
    VVar6.valX_ = dVar1;
    return VVar6;
  }
  VVar5.viol_ = (double)(-(ulong)(dVar1 <= dVar3) & 0x3ff0000000000000);
  VVar5.valX_ = 1.0;
  return VVar5;
}

Assistant:

constexpr size_ty size     (void) const noexcept { return m_size; }